

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

void __thiscall flexbuffers::Builder::Clear(Builder *this)

{
  Builder *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->buf_);
  std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::clear
            (&this->stack_);
  this->finished_ = false;
  this->force_min_bit_width_ = BIT_WIDTH_8;
  std::set<unsigned_long,_flexbuffers::Builder::KeyOffsetCompare,_std::allocator<unsigned_long>_>::
  clear(&this->key_pool);
  std::
  set<std::pair<unsigned_long,_unsigned_long>,_flexbuffers::Builder::StringOffsetCompare,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::clear(&this->string_pool);
  return;
}

Assistant:

void Clear() {
    buf_.clear();
    stack_.clear();
    finished_ = false;
    // flags_ remains as-is;
    force_min_bit_width_ = BIT_WIDTH_8;
    key_pool.clear();
    string_pool.clear();
  }